

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_test_suite.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
anon_unknown.dwarf_1a19a7::read_bytes
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,string *filename)

{
  size_type __new_size;
  StringRef local_2a8;
  AssertionHandler catchAssertionHandler;
  StringRef local_250;
  SourceLineInfo local_240;
  ifstream is;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&is,(string *)filename,_S_bin);
  local_2a8.m_start = "REQUIRE";
  local_2a8.m_size = 7;
  local_240.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_test_suite.cpp"
  ;
  local_240.line = 0x16;
  Catch::StringRef::StringRef(&local_250,"is");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_2a8,&local_240,local_250,Normal);
  local_2a8.m_start = (char *)&is;
  Catch::AssertionHandler::handleExpr<std::ifstream_const&>
            (&catchAssertionHandler,
             (ExprLhs<const_std::basic_ifstream<char,_std::char_traits<char>_>_&> *)&local_2a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::istream::seekg((long)&is,_S_beg);
  __new_size = std::istream::tellg();
  std::istream::seekg((long)&is,_S_beg);
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,__new_size);
  std::istream::read((char *)&is,
                     (long)(__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)
                           ._M_impl.super__Vector_impl_data._M_start);
  std::ifstream::close();
  std::ifstream::~ifstream(&is);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> read_bytes(const std::string& filename)
    {
        std::vector<char> bytes;
        std::ifstream is(filename, std::ifstream::binary);
        REQUIRE(is);
        is.seekg (0, is.end);
        std::streamoff length = is.tellg();
        is.seekg (0, is.beg);
        bytes.resize(static_cast<std::size_t>(length));
        is.read(bytes.data(), static_cast<std::size_t>(length));
        is.close();
        return bytes;
    }